

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O0

xr_ogf * xray_re::xr_ogf::load_ogf(string *path)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  xr_error anon_var_0;
  xr_ogf_v4 *pxStack_30;
  uint version;
  xr_ogf *ogf;
  xr_reader *r;
  xr_file_system *fs;
  string *path_local;
  
  fs = (xr_file_system *)path;
  r = (xr_reader *)xr_file_system::instance();
  ogf = (xr_ogf *)xr_file_system::r_open((xr_file_system *)r,(string *)fs);
  if (ogf == (xr_ogf *)0x0) {
    path_local = (string *)0x0;
  }
  else {
    pxStack_30 = (xr_ogf_v4 *)0x0;
    sVar3 = xr_reader::find_chunk((xr_reader *)ogf,1);
    if (sVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf.cxx"
                    ,0x44,"static xr_ogf *xray_re::xr_ogf::load_ogf(const std::string &)");
    }
    bVar1 = xr_reader::r_u8((xr_reader *)ogf);
    uVar2 = (uint)bVar1;
    if (uVar2 == 3) {
      pxStack_30 = (xr_ogf_v4 *)operator_new(0x770);
      xr_ogf_v3::xr_ogf_v3((xr_ogf_v3 *)pxStack_30);
    }
    else if (uVar2 == 4) {
      pxStack_30 = (xr_ogf_v4 *)operator_new(0x7b8);
      xr_ogf_v4::xr_ogf_v4(pxStack_30);
    }
    else {
      msg("load_ogf: unknown version %u",(ulong)uVar2);
    }
    if (pxStack_30 != (xr_ogf_v4 *)0x0) {
      std::__cxx11::string::operator=((string *)&(pxStack_30->super_xr_ogf).m_path,(string *)fs);
      (*(pxStack_30->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
        [0x15])(pxStack_30,ogf);
    }
    xr_file_system::r_close((xr_file_system *)r,(xr_reader **)&ogf);
    path_local = (string *)pxStack_30;
  }
  return (xr_ogf *)path_local;
}

Assistant:

xr_ogf* xr_ogf::load_ogf(const std::string& path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return 0;

	xr_ogf* ogf = 0;
	if (!r->find_chunk(OGF_HEADER))
		xr_not_expected();

	unsigned version = r->r_u8();
	if (version == OGF3_VERSION) {
		ogf = new xr_ogf_v3();
	} else if (version == OGF4_VERSION) {
		ogf = new xr_ogf_v4();
	} else {
		msg("load_ogf: unknown version %u", version);
	}
	if (ogf) {
		try {
			ogf->m_path = path;
			ogf->load_ogf(*r);
		} catch (xr_error) {
			delete ogf;
			ogf = 0;
		}
	}
	fs.r_close(r);
	return ogf;
}